

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O0

TCPConnection * __thiscall ProtocolTCP::NewServer(ProtocolTCP *this,InterfaceMAC *mac,uint16_t port)

{
  TCPConnection *this_00;
  TCPConnection *connection;
  int i;
  uint16_t port_local;
  InterfaceMAC *mac_local;
  ProtocolTCP *this_local;
  
  connection._0_4_ = 0;
  while( true ) {
    if (4 < (int)connection) {
      return (TCPConnection *)0x0;
    }
    this_00 = (TCPConnection *)(&this->field_0x0 + (long)(int)connection * 0x370);
    if (this_00->State == CLOSED) break;
    connection._0_4_ = (int)connection + 1;
  }
  TCPConnection::Allocate(this_00,mac);
  this_00->State = LISTEN;
  this_00->LocalPort = port;
  return this_00;
}

Assistant:

TCPConnection* ProtocolTCP::NewServer(InterfaceMAC* mac, uint16_t port)
{
    int i;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        TCPConnection& connection = ConnectionList[i];
        if (connection.State == TCPConnection::CLOSED)
        {
            connection.Allocate(mac);
            connection.State = TCPConnection::LISTEN;
            connection.LocalPort = port;
            return &connection;
        }
    }

    return nullptr;
}